

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O1

CURLcode Curl_input_digest(Curl_easy *data,_Bool proxy,char *header)

{
  int iVar1;
  CURLcode CVar2;
  char *chlg;
  undefined7 in_register_00000031;
  digestdata *digest;
  
  digest = &(data->state).proxydigest;
  if ((int)CONCAT71(in_register_00000031,proxy) == 0) {
    digest = &(data->state).digest;
  }
  iVar1 = curl_strnequal(header,"Digest",6);
  if ((iVar1 != 0) && ((header[6] == ' ' || (header[6] == '\t')))) {
    for (chlg = header + 6; (*chlg == ' ' || (*chlg == '\t')); chlg = chlg + 1) {
    }
    CVar2 = Curl_auth_decode_digest_http_message(chlg,digest);
    return CVar2;
  }
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

CURLcode Curl_input_digest(struct Curl_easy *data,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header) || !ISBLANK(header[6]))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISBLANK(*header))
    header++;

  return Curl_auth_decode_digest_http_message(header, digest);
}